

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O2

bool iutest::TestPartResult::type_is_failed(Type type)

{
  bool bVar1;
  
  bVar1 = TestFlag::IsEnableFlag(0x80);
  return kSuccess < type || type == kWarning && bVar1;
}

Assistant:

static bool type_is_failed(Type type) IUTEST_CXX_NOEXCEPT_SPEC
    {
        if( iutest::IUTEST_FLAG(warning_into_error) )
        {
            if( type == kWarning )
            {
                return true;
            }
        }
        return type > kSuccess;
    }